

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teststop.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  sclock_t diff;
  sclock_t start;
  SystemClock<(ClockType)2> clock;
  
  SystemClock<(ClockType)2>::SystemClock(&clock,0);
  Clock::getResolution(&clock.super_Clock);
  dVar4 = 0.0;
  iVar2 = 100000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    clock.thread_data.stopped = true;
    fVar1 = (clock.thread_data.clock)->a;
    usleep(1000);
    clock.thread_data.stopped = false;
    dVar4 = dVar4 + (double)((clock.thread_data.clock)->a - fVar1);
  }
  if (dVar4 / 100000.0 <= 0.0001) {
    fprintf(_stderr,"%.20f\n",((dVar4 / 100000.0) / 0.001) * 100.0);
    SystemClock<(ClockType)2>::~SystemClock(&clock);
    return 0;
  }
  fprintf(_stderr,"%.20f is greater than 10 percent (100 microseconds) of measured time.");
  exit(1);
}

Assistant:

int 
main( int argc, char **argv )
{
   SystemClock< System > clock( 0 /** core zero **/ );   
   const auto resolution( clock.getResolution() );
   const auto microseconds( 1000 );
   const auto num_iterations( 1e5 );
   double diff_accum( 0.0 );
   for( auto iterations( 0 ); iterations < num_iterations; iterations++ )
   {
      volatile auto start( clock.stop() );
      usleep( (useconds_t) microseconds );
      volatile const auto diff( clock.start() - start );
      diff_accum += diff;
   }
   const double average( diff_accum / num_iterations );
   const double tenperc( .001 /** microseconds **/ * .10 );
   if( std::isgreater( average, tenperc ) )
   {
      std::fprintf( stderr, 
                    "%.20f is greater than 10 percent (100 microseconds) of measured time.", 
                    average );
      std::exit( EXIT_FAILURE );
   }
   const double actual_fraction( ( average / .001 ) * 100 );
   //print out the actual fraction of time we're off
   std::fprintf( stderr, "%.20f\n", actual_fraction );
   /** else return success **/
   return( EXIT_SUCCESS );
}